

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O2

void anon_unknown.dwarf_1665be::getMeasureData
               (Locale *locale,MeasureUnit *unit,UNumberUnitWidth *width,UnicodeString *outArray,
               UErrorCode *status)

{
  char *pcVar1;
  StringPiece *this;
  LocalUResourceBundlePointer unitsBundle;
  PluralTableSink sink;
  CharString key;
  LocalPointerBase<UResourceBundle> local_e8;
  PluralTableSink local_e0;
  StringPiece local_d0;
  StringPiece local_c0;
  StringPiece local_b0;
  StringPiece local_a0;
  StringPiece local_90;
  CharString local_80;
  StringPiece local_40;
  StringPiece local_30;
  
  PluralTableSink::PluralTableSink(&local_e0,outArray);
  local_e8.ptr = ures_open_63("icudt63l-unit",locale->fullName,status);
  if (U_ZERO_ERROR < *status) goto LAB_00251721;
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&local_80.buffer);
  local_80.len = 0;
  *local_80.buffer.ptr = '\0';
  icu_63::StringPiece::StringPiece(&local_90,"units");
  icu_63::CharString::append(&local_80,local_90.ptr_,local_90.length_,status);
  if (*width == UNUM_UNIT_WIDTH_SHORT) {
    this = &local_40;
    icu_63::StringPiece::StringPiece(this,"Short");
LAB_00251649:
    icu_63::CharString::append(&local_80,this->ptr_,this->length_,status);
  }
  else if (*width == UNUM_UNIT_WIDTH_NARROW) {
    this = &local_30;
    icu_63::StringPiece::StringPiece(this,"Narrow");
    goto LAB_00251649;
  }
  icu_63::StringPiece::StringPiece(&local_a0,"/");
  icu_63::CharString::append(&local_80,local_a0.ptr_,local_a0.length_,status);
  pcVar1 = icu_63::MeasureUnit::getType(unit);
  icu_63::StringPiece::StringPiece(&local_b0,pcVar1);
  icu_63::CharString::append(&local_80,local_b0.ptr_,local_b0.length_,status);
  icu_63::StringPiece::StringPiece(&local_c0,"/");
  icu_63::CharString::append(&local_80,local_c0.ptr_,local_c0.length_,status);
  pcVar1 = icu_63::MeasureUnit::getSubtype(unit);
  icu_63::StringPiece::StringPiece(&local_d0,pcVar1);
  icu_63::CharString::append(&local_80,local_d0.ptr_,local_d0.length_,status);
  ures_getAllItemsWithFallback_63
            (local_e8.ptr,local_80.buffer.ptr,&local_e0.super_ResourceSink,status);
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&local_80.buffer);
LAB_00251721:
  icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_e8);
  icu_63::ResourceSink::~ResourceSink(&local_e0.super_ResourceSink);
  return;
}

Assistant:

void getMeasureData(const Locale &locale, const MeasureUnit &unit, const UNumberUnitWidth &width,
                    UnicodeString *outArray, UErrorCode &status) {
    PluralTableSink sink(outArray);
    LocalUResourceBundlePointer unitsBundle(ures_open(U_ICUDATA_UNIT, locale.getName(), &status));
    if (U_FAILURE(status)) { return; }
    CharString key;
    key.append("units", status);
    if (width == UNUM_UNIT_WIDTH_NARROW) {
        key.append("Narrow", status);
    } else if (width == UNUM_UNIT_WIDTH_SHORT) {
        key.append("Short", status);
    }
    key.append("/", status);
    key.append(unit.getType(), status);
    key.append("/", status);
    key.append(unit.getSubtype(), status);
    ures_getAllItemsWithFallback(unitsBundle.getAlias(), key.data(), sink, status);
}